

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cc
# Opt level: O1

bool __thiscall rcg::Buffer::getDataLargerThanBuffer(Buffer *this)

{
  void *pvVar1;
  bool8_t ret;
  size_t size;
  INFO_DATATYPE type;
  undefined1 local_19;
  size_t local_18;
  INFO_DATATYPE local_c;
  
  pvVar1 = Stream::getHandle(this->parent);
  local_19 = 0;
  local_18 = 1;
  if (this->buffer != (BUFFER_HANDLE)0x0 && pvVar1 != (void *)0x0) {
    (*((this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ->DSGetBufferInfo)(pvVar1,this->buffer,0x1d,&local_c,&local_19,&local_18);
  }
  return (bool)local_19;
}

Assistant:

bool Buffer::getDataLargerThanBuffer() const
{
  return getBufferBool(gentl, parent->getHandle(), buffer,
                       GenTL::BUFFER_INFO_DATA_LARGER_THAN_BUFFER);
}